

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

void * memchr(void *__s,int __c,size_t __n)

{
  uchar *s_;
  bool bVar1;
  
  while( true ) {
    bVar1 = __n == 0;
    __n = __n - 1;
    if (bVar1) {
      return (void *)0x0;
    }
    if (*__s == (char)__c) break;
    __s = (void *)((long)__s + 1);
  }
  return (char *)__s;
}

Assistant:

void *memchr(const void *s, int c, size_t n) {
    const unsigned char *s_ = s;
    const unsigned char c_ = (unsigned char)c;

    for (size_t i = 0; i < n; ++i) {
        if (s_[i] == c_) {
            return (void *)(s_ + i);
        }
    }

    return NULL;
}